

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ApiPhraseNextColumn(Fts5Context *pCtx,Fts5PhraseIter *pIter,int *piCol)

{
  int iVar1;
  u32 local_38;
  u32 local_34;
  int dummy;
  int iIncr;
  Fts5Config *pConfig;
  Fts5Cursor *pCsr;
  int *piCol_local;
  Fts5PhraseIter *pIter_local;
  Fts5Context *pCtx_local;
  
  _dummy = *(long *)(*(long *)pCtx + 0x18);
  pConfig = (Fts5Config *)pCtx;
  pCsr = (Fts5Cursor *)piCol;
  piCol_local = (int *)pIter;
  pIter_local = (Fts5PhraseIter *)pCtx;
  if (*(int *)(_dummy + 0x5c) == 2) {
    if (pIter->a < pIter->b) {
      iVar1 = sqlite3Fts5GetVarint32(pIter->a,&local_34);
      *(long *)piCol_local = *(long *)piCol_local + (long)iVar1;
      *(u32 *)&(pCsr->base).pVtab = (local_34 - 2) + *(int *)&(pCsr->base).pVtab;
    }
    else {
      *piCol = -1;
    }
  }
  else {
    while (*(ulong *)piCol_local < *(ulong *)(piCol_local + 2)) {
      if (**(char **)piCol_local == '\x01') {
        iVar1 = sqlite3Fts5GetVarint32((uchar *)(*(long *)piCol_local + 1),(u32 *)pCsr);
        *(long *)piCol_local = *(long *)piCol_local + (long)(iVar1 + 1);
        return;
      }
      iVar1 = sqlite3Fts5GetVarint32(*(uchar **)piCol_local,&local_38);
      *(long *)piCol_local = *(long *)piCol_local + (long)iVar1;
    }
    *(undefined4 *)&(pCsr->base).pVtab = 0xffffffff;
  }
  return;
}

Assistant:

static void fts5ApiPhraseNextColumn(
  Fts5Context *pCtx, 
  Fts5PhraseIter *pIter, 
  int *piCol
){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5Config *pConfig = ((Fts5Table*)(pCsr->base.pVtab))->pConfig;

  if( pConfig->eDetail==FTS5_DETAIL_COLUMNS ){
    if( pIter->a>=pIter->b ){
      *piCol = -1;
    }else{
      int iIncr;
      pIter->a += fts5GetVarint32(&pIter->a[0], iIncr);
      *piCol += (iIncr-2);
    }
  }else{
    while( 1 ){
      int dummy;
      if( pIter->a>=pIter->b ){
        *piCol = -1;
        return;
      }
      if( pIter->a[0]==0x01 ) break;
      pIter->a += fts5GetVarint32(pIter->a, dummy);
    }
    pIter->a += 1 + fts5GetVarint32(&pIter->a[1], *piCol);
  }
}